

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty.c++:334:89)>
::getImpl(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_c__:334:89)>
          *this,ExceptionOrValue *output)

{
  uint uVar1;
  TwoPartyVatNetwork *pTVar2;
  bool bVar3;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar4;
  long lVar5;
  ExceptionOrValue *output_00;
  ExceptionOr<kj::_::Void> depResult;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_378;
  ExceptionOr<kj::Promise<void>_> local_370;
  ExceptionOrValue local_1c8;
  char local_30;
  
  output_00 = &local_1c8;
  local_1c8.exception.ptr.isSet = false;
  local_30 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,output_00);
  if (local_1c8.exception.ptr.isSet == true) {
    local_370.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_1c8.exception.ptr.field_1.value.ownFile.content.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_1c8.exception.ptr.field_1.value.ownFile.content.size_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_1c8.exception.ptr.field_1.value.ownFile.content.disposer;
    local_1c8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_1c8.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_1c8.exception.ptr.field_1.value.file;
    local_370.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_1c8.exception.ptr.field_1._32_8_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_1c8.exception.ptr.field_1.value.description.content.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_1c8.exception.ptr.field_1.value.description.content.size_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_1c8.exception.ptr.field_1.value.description.content.disposer;
    local_1c8.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_1c8.exception.ptr.field_1.value.description.content.size_ = 0;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_1c8.exception.ptr.field_1.value.context.ptr.disposer;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         local_1c8.exception.ptr.field_1.value.context.ptr.ptr;
    local_1c8.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_1c8.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_1c8.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_1c8.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_1c8.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_1c8.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_370.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_1c8.exception.ptr.field_1 + 0x68),0x105);
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_1c8.exception.ptr.field_1.value.details.builder.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_1c8.exception.ptr.field_1.value.details.builder.pos;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_1c8.exception.ptr.field_1.value.details.builder.endPtr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_1c8.exception.ptr.field_1.value.details.builder.disposer;
    local_1c8.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_1c8.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1c8.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_370.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_370)
    ;
    aVar4 = local_370.value.ptr.field_1;
    if ((local_370.value.ptr.isSet == true) &&
       (local_370.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
      local_370.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar4);
    }
    if (local_370.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_370.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    goto LAB_0035fc5c;
  }
  if (local_30 != '\x01') goto LAB_0035fc5c;
  pTVar2 = (this->func).this;
  uVar1 = (pTVar2->stream).tag;
  if (uVar1 == 1) {
    lVar5 = 0x20;
LAB_0035fbc8:
    output_00 = *(ExceptionOrValue **)
                 ((long)(pTVar2->peerVatId).super_MessageBuilder.arenaSpace + lVar5 + -0x40);
    bVar3 = true;
  }
  else {
    if (uVar1 == 2) {
      lVar5 = 0x28;
      goto LAB_0035fbc8;
    }
    bVar3 = false;
  }
  if (!bVar3) {
    unreachable();
  }
  (**(code **)(*(long *)&(output_00->exception).ptr + 0x20))(&local_378);
  local_370.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_370.value.ptr.isSet = true;
  local_370.value.ptr.field_1 = local_378;
  local_378 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
  ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_370);
  aVar4 = local_370.value.ptr.field_1;
  if ((local_370.value.ptr.isSet == true) &&
     (local_370.value.ptr.field_1 !=
      (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
    local_370.value.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
    PromiseDisposer::dispose((PromiseArenaMember *)aVar4);
  }
  if (local_370.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_370.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  aVar4 = local_378;
  if (local_378 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0) {
    local_378 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
    PromiseDisposer::dispose((PromiseArenaMember *)aVar4);
  }
LAB_0035fc5c:
  if (local_1c8.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1c8.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }